

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O1

void __thiscall
spvtools::opt::IRContext::CollectCallTreeFromRoots
          (IRContext *this,uint entryId,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *funcs)

{
  Function *func;
  __hashtable *__h;
  IRContext *this_00;
  uint32_t fi;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> roots;
  uint local_88;
  uint local_84;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_80;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (uint *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = (uint *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (uint *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = (uint *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_84 = entryId;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_78,0);
  if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_78._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<unsigned_int,std::allocator<unsigned_int>>::_M_push_back_aux<unsigned_int_const&>
              ((deque<unsigned_int,std::allocator<unsigned_int>> *)&local_78,&local_84);
  }
  else {
    *local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = local_84;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_78._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      local_88 = *local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_78._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_78._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_78._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_78._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_78._M_impl.super__Deque_impl_data._M_start._M_last =
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
        local_78._M_impl.super__Deque_impl_data._M_start._M_first =
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_78._M_impl.super__Deque_impl_data._M_start._M_node =
             local_78._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_78._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      local_80 = funcs;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                (funcs,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_88,&local_80);
      this_00 = this;
      func = GetFunction(this,local_88);
      AddCalls(this_00,func,
               (queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_78);
    } while (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_78);
  return;
}

Assistant:

void IRContext::CollectCallTreeFromRoots(unsigned entryId,
                                         std::unordered_set<uint32_t>* funcs) {
  std::queue<uint32_t> roots;
  roots.push(entryId);
  while (!roots.empty()) {
    const uint32_t fi = roots.front();
    roots.pop();
    funcs->insert(fi);
    Function* fn = GetFunction(fi);
    AddCalls(fn, &roots);
  }
}